

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Abc_Obj_t *pFanin;
  word *pTruth;
  char *pSop;
  int iVar4;
  
  p_00 = Vec_IntStart(pNtk->vObjs->nSize);
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar4);
    Vec_IntWriteEntry(p_00,(pAVar3->field_6).iTemp,pAVar3->Id);
  }
  for (iVar4 = 0; iVar1 = pNtk->vObjs->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar4);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       (0 < (pAVar3->field_6).iTemp)) {
      Vec_IntWriteEntry(p_00,(pAVar3->field_6).iTemp,pAVar3->Id);
    }
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar4);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      iVar1 = Sfm_NodeReadFixed(p,(pAVar3->field_6).iTemp);
      if (iVar1 == 0) {
        Abc_ObjRemoveFanins(pAVar3);
      }
    }
    iVar1 = pNtk->vObjs->nSize;
  }
  p_01 = Vec_IntAlloc(0x10000);
  iVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar4) {
      Vec_IntFree(p_01);
      Vec_IntFree(p_00);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar4);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       ((pAVar3->field_6).iTemp != 0)) {
      iVar1 = Sfm_NodeReadFixed(p,(pAVar3->field_6).iTemp);
      if (iVar1 == 0) {
        iVar1 = Sfm_NodeReadUsed(p,(pAVar3->field_6).iTemp);
        if (iVar1 == 0) {
          Abc_NtkDeleteObj(pAVar3);
        }
        else {
          p_02 = Sfm_NodeReadFanins(p,(pAVar3->field_6).iTemp);
          for (iVar1 = 0; iVar1 < p_02->nSize; iVar1 = iVar1 + 1) {
            iVar2 = Vec_IntEntry(p_02,iVar1);
            iVar2 = Vec_IntEntry(p_00,iVar2);
            pFanin = Abc_NtkObj(pNtk,iVar2);
            Abc_ObjAddFanin(pAVar3,pFanin);
          }
          pTruth = Sfm_NodeReadTruth(p,(pAVar3->field_6).iTemp);
          pSop = Abc_SopCreateFromTruthIsop((Mem_Flex_t *)pNtk->pManFunc,p_02->nSize,pTruth,p_01);
          (pAVar3->field_5).pData = pSop;
          iVar1 = Abc_SopGetVarNum(pSop);
          if (iVar1 != p_02->nSize) {
            __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                          ,0x14b,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
          }
        }
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        pNode->pData = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), pTruth, vCover );
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}